

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_trimchar(char *dest,int dest_sz,char *src,char trim_ch)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = sx_strlen(src);
  uVar1 = dest_sz - 1U;
  if ((int)uVar2 < (int)(dest_sz - 1U)) {
    uVar1 = uVar2;
  }
  uVar3 = 0;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  iVar4 = 0;
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    if (src[uVar3] != trim_ch) {
      dest[iVar4] = src[uVar3];
      iVar4 = iVar4 + 1;
    }
  }
  dest[iVar4] = '\0';
  return dest;
}

Assistant:

char* sx_trimchar(char* dest, int dest_sz, const char* src, char trim_ch)
{
    int len = sx_min(sx_strlen(src), dest_sz - 1);
    int offset = 0;
    for (int i = 0; i < len; i++) {
        if (trim_ch != src[i])
            dest[offset++] = src[i];
    }
    dest[offset] = '\0';
    return dest;
}